

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlGlyphClassDefn.cpp
# Opt level: O0

GdlGlyphClassMember * __thiscall
GdlGlyphClassDefn::AddGlyphToClass
          (GdlGlyphClassDefn *this,GrpLineAndFile *lnf,GlyphType glft,int nFirst)

{
  GdlGlyphClassMember *pGVar1;
  GdlGlyphDefn *in_RDI;
  GdlGlyphDefn *pglf;
  int in_stack_ffffffffffffffb8;
  GlyphType in_stack_ffffffffffffffbc;
  GdlGlyphClassMember *pglfd;
  GdlGlyphClassDefn *in_stack_ffffffffffffffd0;
  
  pGVar1 = (GdlGlyphClassMember *)operator_new(0xb0);
  GdlGlyphDefn::GdlGlyphDefn(in_RDI,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  pglfd = pGVar1;
  GdlObject::SetLineAndFile
            ((GdlObject *)in_RDI,
             (GrpLineAndFile *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  AddMember(in_stack_ffffffffffffffd0,pglfd,(GrpLineAndFile *)in_RDI);
  return pGVar1;
}

Assistant:

GdlGlyphClassMember * GdlGlyphClassDefn::AddGlyphToClass(GrpLineAndFile const& lnf,
	GlyphType glft, int nFirst)
{
	GdlGlyphDefn * pglf = new GdlGlyphDefn(glft, nFirst);
	pglf->SetLineAndFile(lnf);
	AddMember(pglf, lnf);
	return pglf;
}